

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileave3_naive_matches_regular_::run
          (Test_bitileave_ileave3_naive_matches_regular_ *this)

{
  SourceLocation loc;
  ull_type uVar1;
  long lVar2;
  bool bVar3;
  string_view msg;
  uint32_t v [3];
  uniform_int_distribution<unsigned_int> distr;
  mt19937 rng;
  result_type_conflict local_14ac;
  result_type_conflict local_14a8;
  result_type_conflict local_14a4;
  ull_type local_14a0;
  ull_type local_1498;
  char *local_1490;
  char *pcStack_1488;
  undefined8 local_1480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  param_type local_1458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1410;
  enable_if_t<isStringifieable<unsigned_long_long>,_std::string> local_13f0;
  enable_if_t<isStringifieable<unsigned_long_long>,_std::string> local_13d0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b0,0x3039);
  local_1458._M_a = 0;
  local_1458._M_b = 0xffffffff;
  lVar2 = 0x400;
  do {
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) {
      return;
    }
    local_14ac = std::uniform_int_distribution<unsigned_int>::operator()
                           ((uniform_int_distribution<unsigned_int> *)&local_1458,&local_13b0);
    local_14a8 = std::uniform_int_distribution<unsigned_int>::operator()
                           ((uniform_int_distribution<unsigned_int> *)&local_1458,&local_13b0);
    local_14a4 = std::uniform_int_distribution<unsigned_int>::operator()
                           ((uniform_int_distribution<unsigned_int> *)&local_1458,&local_13b0);
    uVar1 = detail::ileave_arr_impl<unsigned_int,0ul,1ul,2ul>(&local_14ac);
    local_1498 = uVar1;
    local_14a0 = detail::ileave_naive_impl<unsigned_int,unsigned_int,unsigned_int,0ul,1ul,2ul>
                           (local_14ac,local_14a8,local_14a4);
  } while (uVar1 == local_14a0);
  stringify<unsigned_long_long>(&local_13d0,&local_1498);
  std::operator+(&local_1450,
                 "Comparison failed: ileave(v) == detail::ileave_naive(v[0], v[1], v[2]) (with \"ileave(v)\"="
                 ,&local_13d0);
  std::operator+(&local_1430,&local_1450,", \"detail::ileave_naive(v[0], v[1], v[2])\"=");
  stringify<unsigned_long_long>(&local_13f0,&local_14a0);
  std::operator+(&local_1410,&local_1430,&local_13f0);
  std::operator+(&local_1478,&local_1410,")");
  local_1490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  pcStack_1488 = "run";
  local_1480 = 0x103;
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0x103;
  msg._M_str = local_1478._M_dataplus._M_p;
  msg._M_len = local_1478._M_string_length;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileave3_naive_matches_regular)
{
    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint32_t> distr{0, std::numeric_limits<std::uint32_t>::max()};

    for (size_t i = 0; i < 1024 * 1; ++i) {
        std::uint32_t v[] = {distr(rng), distr(rng), distr(rng)};
        BITMANIP_ASSERT_EQ(ileave(v), detail::ileave_naive(v[0], v[1], v[2]));
    }
}